

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O1

void __thiscall icu_63::Formattable::Formattable(Formattable *this,UnicodeString *stringToAdopt)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_003a7d18;
  (this->fBogus).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b5258;
  (this->fBogus).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fValue).fObject = (UObject *)0x0;
  this->fType = kLong;
  this->fDecimalStr = (CharString *)0x0;
  this->fDecimalQuantity = (DecimalQuantity *)0x0;
  UnicodeString::setToBogus(&this->fBogus);
  this->fType = kString;
  (this->fValue).fString = stringToAdopt;
  return;
}

Assistant:

Formattable::Formattable(UnicodeString* stringToAdopt)
{
    init();
    fType = kString;
    fValue.fString = stringToAdopt;
}